

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall
QGraphicsViewPrivate::updateRubberBand(QGraphicsViewPrivate *this,QMouseEvent *event)

{
  QPointF _t3;
  QPointF _t3_00;
  QPointF _t2;
  QPointF _t2_00;
  QRect _t1;
  QRect _t1_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QGraphicsView *pQVar7;
  int *piVar8;
  QWidget *rect;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *q;
  QPainterPath selectionArea;
  QPoint ep;
  QPoint mp;
  QRect oldRubberband;
  QRect *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  QRect *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  int iVar9;
  undefined4 in_stack_fffffffffffffe44;
  QTransform *in_stack_fffffffffffffe48;
  QWidget *in_stack_fffffffffffffe50;
  QPainterPath *path;
  undefined4 in_stack_fffffffffffffe60;
  undefined1 *local_160;
  QRegion local_158;
  qreal local_150;
  qreal local_148;
  qreal local_140;
  qreal local_138;
  undefined8 local_130;
  undefined8 local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  undefined8 local_108;
  undefined8 local_100;
  QPointF local_f8;
  QPoint local_e8;
  QPoint local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  QPointF local_c8;
  QPointF local_b8;
  undefined8 local_a4;
  undefined8 local_9c;
  undefined8 local_94;
  undefined8 local_8c;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_84;
  QRegion local_80;
  QPointF local_78;
  QPoint local_68;
  QPoint local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = q_func(in_RDI);
  if (((in_RDI->dragMode == RubberBandDrag) && ((*(uint *)&in_RDI->field_0x300 & 1) != 0)) &&
     ((in_RDI->rubberBanding & 1U) != 0)) {
    path = (QPainterPath *)&in_RDI->mousePressViewPoint;
    local_78 = QSinglePointEvent::position((QSinglePointEvent *)0xa337db);
    local_68 = QPointF::toPoint((QPointF *)
                                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    local_60 = ::operator-((QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                           (QPoint *)in_stack_fffffffffffffe28);
    iVar2 = QPoint::manhattanLength
                      ((QPoint *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    iVar3 = QApplication::startDragDistance();
    if (iVar3 <= iVar2) {
      if ((in_RDI->viewportUpdateMode != NoViewportUpdate) &&
         (bVar1 = QRect::isEmpty((QRect *)CONCAT44(in_stack_fffffffffffffe24,
                                                   in_stack_fffffffffffffe20)), !bVar1)) {
        if (in_RDI->viewportUpdateMode == FullViewportUpdate) {
          updateAll((QGraphicsViewPrivate *)
                    CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        }
        else {
          in_stack_fffffffffffffe50 =
               QAbstractScrollArea::viewport
                         ((QAbstractScrollArea *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          QAbstractScrollArea::viewport
                    ((QAbstractScrollArea *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          rubberBandRegion((QGraphicsViewPrivate *)
                           CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                           (QWidget *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                           in_stack_fffffffffffffe28);
          QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          (QRegion *)in_stack_fffffffffffffe28);
          QRegion::~QRegion(&local_80);
        }
      }
      local_84.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QSinglePointEvent::buttons
                     ((QSinglePointEvent *)
                      CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      bVar1 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_84);
      if (bVar1) {
        in_RDI->rubberBanding = false;
        in_RDI->rubberBandSelectionOperation = ReplaceSelection;
        bVar1 = QRect::isNull((QRect *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                             );
        if (!bVar1) {
          QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          (in_RDI->rubberBandRect).x1 = (Representation)(undefined4)local_94;
          (in_RDI->rubberBandRect).y1 = (Representation)local_94._4_4_;
          (in_RDI->rubberBandRect).x2 = (Representation)(undefined4)local_8c;
          (in_RDI->rubberBandRect).y2 = (Representation)local_8c._4_4_;
          local_a4._0_4_ = (in_RDI->rubberBandRect).x1;
          local_a4._4_4_ = (in_RDI->rubberBandRect).y1;
          local_9c._0_4_ = (in_RDI->rubberBandRect).x2;
          local_9c._4_4_ = (in_RDI->rubberBandRect).y2;
          QPointF::QPointF(&local_b8);
          QPointF::QPointF(&local_c8);
          _t1.y1.m_i = in_stack_fffffffffffffe44;
          _t1.x1.m_i = in_stack_fffffffffffffe40;
          _t1._8_8_ = pQVar7;
          _t2.xp._4_4_ = in_stack_fffffffffffffe34;
          _t2.xp._0_4_ = in_stack_fffffffffffffe30;
          _t2.yp._0_4_ = in_stack_fffffffffffffe38;
          _t2.yp._4_4_ = in_stack_fffffffffffffe3c;
          _t3.xp._4_4_ = in_stack_fffffffffffffe24;
          _t3.xp._0_4_ = in_stack_fffffffffffffe20;
          _t3.yp = (qreal)in_stack_fffffffffffffe28;
          QGraphicsView::rubberBandChanged((QGraphicsView *)in_stack_fffffffffffffe18,_t1,_t2,_t3);
        }
      }
      else {
        local_d8._0_4_ = (in_RDI->rubberBandRect).x1;
        local_d8._4_4_ = (in_RDI->rubberBandRect).y1;
        local_d0._0_4_ = (in_RDI->rubberBandRect).x2;
        local_d0._4_4_ = (in_RDI->rubberBandRect).y2;
        local_e0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        local_e0 = QGraphicsView::mapFromScene
                             ((QGraphicsView *)
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              (QPointF *)
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        local_e8 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        local_f8 = QSinglePointEvent::position((QSinglePointEvent *)0xa33a63);
        local_e8 = QPointF::toPoint((QPointF *)
                                    CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        local_10c = QPoint::x((QPoint *)0xa33a97);
        local_110 = QPoint::x((QPoint *)0xa33aab);
        piVar8 = qMin<int>(&local_10c,&local_110);
        iVar3 = *piVar8;
        local_114 = QPoint::y((QPoint *)0xa33ada);
        local_118 = QPoint::y((QPoint *)0xa33aee);
        piVar8 = qMin<int>(&local_114,&local_118);
        iVar9 = *piVar8;
        iVar4 = QPoint::x((QPoint *)0xa33b1d);
        local_11c = QPoint::x((QPoint *)0xa33b2e);
        local_11c = iVar4 - local_11c;
        iVar5 = qAbs<int>(&local_11c);
        iVar5 = iVar5 + 1;
        iVar6 = QPoint::y((QPoint *)0xa33b5e);
        local_120 = QPoint::y((QPoint *)0xa33b6f);
        local_120 = iVar6 - local_120;
        qAbs<int>(&local_120);
        QRect::QRect(in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
                     (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18)
        ;
        (in_RDI->rubberBandRect).x1 = (Representation)(undefined4)local_108;
        (in_RDI->rubberBandRect).y1 = (Representation)local_108._4_4_;
        (in_RDI->rubberBandRect).x2 = (Representation)(undefined4)local_100;
        (in_RDI->rubberBandRect).y2 = (Representation)local_100._4_4_;
        bVar1 = ::operator!=((QRect *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                             in_stack_fffffffffffffe18);
        if ((bVar1) ||
           (bVar1 = ::operator!=((QPointF *)
                                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                                 (QPointF *)in_stack_fffffffffffffe18), bVar1)) {
          (in_RDI->lastRubberbandScenePoint).xp = (in_RDI->lastMouseMoveScenePoint).xp;
          (in_RDI->lastRubberbandScenePoint).yp = (in_RDI->lastMouseMoveScenePoint).yp;
          local_d8._0_4_ = (in_RDI->rubberBandRect).x1;
          local_d8._4_4_ = (in_RDI->rubberBandRect).y1;
          local_d0._0_4_ = (in_RDI->rubberBandRect).x2;
          local_d0._4_4_ = (in_RDI->rubberBandRect).y2;
          local_130._0_4_ = (in_RDI->rubberBandRect).x1;
          local_130._4_4_ = (in_RDI->rubberBandRect).y1;
          local_128._0_4_ = (in_RDI->rubberBandRect).x2;
          local_128._4_4_ = (in_RDI->rubberBandRect).y2;
          local_140 = (in_RDI->mousePressScenePoint).xp;
          local_138 = (in_RDI->mousePressScenePoint).yp;
          local_150 = (in_RDI->lastRubberbandScenePoint).xp;
          local_148 = (in_RDI->lastRubberbandScenePoint).yp;
          _t1_00.y1.m_i = iVar5;
          _t1_00.x1.m_i = iVar9;
          _t1_00._8_8_ = in_stack_fffffffffffffe48;
          _t2_00.xp._4_4_ = iVar4;
          _t2_00.xp._0_4_ = in_stack_fffffffffffffe30;
          _t2_00.yp._0_4_ = iVar6;
          _t2_00.yp._4_4_ = iVar3;
          _t3_00.xp._4_4_ = in_stack_fffffffffffffe24;
          _t3_00.xp._0_4_ = in_stack_fffffffffffffe20;
          _t3_00.yp = (qreal)in_stack_fffffffffffffe28;
          QGraphicsView::rubberBandChanged
                    ((QGraphicsView *)in_stack_fffffffffffffe18,_t1_00,_t2_00,_t3_00);
        }
        if (in_RDI->viewportUpdateMode != NoViewportUpdate) {
          if (in_RDI->viewportUpdateMode == FullViewportUpdate) {
            updateAll((QGraphicsViewPrivate *)
                      CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          }
          else {
            rect = QAbstractScrollArea::viewport
                             ((QAbstractScrollArea *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
            QAbstractScrollArea::viewport
                      ((QAbstractScrollArea *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
            rubberBandRegion((QGraphicsViewPrivate *)CONCAT44(iVar3,iVar6),
                             (QWidget *)CONCAT44(iVar4,in_stack_fffffffffffffe30),(QRect *)rect);
            QWidget::update((QWidget *)CONCAT44(iVar4,in_stack_fffffffffffffe30),(QRegion *)rect);
            QRegion::~QRegion(&local_158);
          }
        }
        local_160 = &DAT_aaaaaaaaaaaaaaaa;
        QPainterPath::QPainterPath((QPainterPath *)&local_160);
        QGraphicsView::mapToScene
                  ((QGraphicsView *)CONCAT44(iVar5,iVar9),(QRect *)CONCAT44(iVar3,iVar6));
        QPainterPath::addPolygon((QPolygonF *)&local_160);
        QPolygonF::~QPolygonF((QPolygonF *)0xa33db5);
        QPainterPath::closeSubpath();
        bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa33dd3);
        if (bVar1) {
          QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa33dea);
          QGraphicsView::viewportTransform((QGraphicsView *)CONCAT44(iVar3,iVar6));
          QGraphicsScene::setSelectionArea
                    ((QGraphicsScene *)CONCAT44(iVar2,in_stack_fffffffffffffe60),path,
                     (ItemSelectionOperation)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                     (ItemSelectionMode)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        }
        QPainterPath::~QPainterPath((QPainterPath *)&local_160);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsViewPrivate::updateRubberBand(const QMouseEvent *event)
{
    Q_Q(QGraphicsView);
    if (dragMode != QGraphicsView::RubberBandDrag || !sceneInteractionAllowed || !rubberBanding)
        return;
    // Check for enough drag distance
    if ((mousePressViewPoint - event->position().toPoint()).manhattanLength() < QApplication::startDragDistance())
        return;

    // Update old rubberband
    if (viewportUpdateMode != QGraphicsView::NoViewportUpdate && !rubberBandRect.isEmpty()) {
        if (viewportUpdateMode != QGraphicsView::FullViewportUpdate)
            q->viewport()->update(rubberBandRegion(q->viewport(), rubberBandRect));
        else
            updateAll();
    }

    // Stop rubber banding if the user has let go of all buttons (even
    // if we didn't get the release events).
    if (!event->buttons()) {
        rubberBanding = false;
        rubberBandSelectionOperation = Qt::ReplaceSelection;
        if (!rubberBandRect.isNull()) {
            rubberBandRect = QRect();
            emit q->rubberBandChanged(rubberBandRect, QPointF(), QPointF());
        }
        return;
    }

    QRect oldRubberband = rubberBandRect;

    // Update rubberband position
    const QPoint mp = q->mapFromScene(mousePressScenePoint);
    const QPoint ep = event->position().toPoint();
    rubberBandRect = QRect(qMin(mp.x(), ep.x()), qMin(mp.y(), ep.y()),
                           qAbs(mp.x() - ep.x()) + 1, qAbs(mp.y() - ep.y()) + 1);

    if (rubberBandRect != oldRubberband || lastRubberbandScenePoint != lastMouseMoveScenePoint) {
        lastRubberbandScenePoint = lastMouseMoveScenePoint;
        oldRubberband = rubberBandRect;
        emit q->rubberBandChanged(rubberBandRect, mousePressScenePoint, lastRubberbandScenePoint);
    }

    // Update new rubberband
    if (viewportUpdateMode != QGraphicsView::NoViewportUpdate) {
        if (viewportUpdateMode != QGraphicsView::FullViewportUpdate)
            q->viewport()->update(rubberBandRegion(q->viewport(), rubberBandRect));
        else
            updateAll();
    }
            // Set the new selection area
    QPainterPath selectionArea;
    selectionArea.addPolygon(q->mapToScene(rubberBandRect));
    selectionArea.closeSubpath();
    if (scene)
        scene->setSelectionArea(selectionArea, rubberBandSelectionOperation, rubberBandSelectionMode, q->viewportTransform());
}